

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O1

bool __thiscall helics::TimeCoordinator::updateNextExecutionTime(TimeCoordinator *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  Time TVar4;
  long lVar5;
  
  lVar1 = (this->time_exec).internalTimeCode;
  if ((this->info).uninterruptible == true) {
    if (this->iterating == NO_ITERATIONS) {
LAB_00303065:
      TVar4.internalTimeCode = (this->time_requested).internalTimeCode;
      goto LAB_00303107;
    }
    lVar3 = (this->time_message).internalTimeCode;
    lVar2 = (this->time_value).internalTimeCode;
    if (lVar2 < lVar3) {
      lVar3 = lVar2;
    }
    (this->time_exec).internalTimeCode = lVar3;
    if (lVar3 != 0x7fffffffffffffff) {
      (this->time_exec).internalTimeCode = lVar3 + (this->info).inputDelay.internalTimeCode;
    }
    TVar4.internalTimeCode = (this->time_granted).internalTimeCode;
    if (TVar4.internalTimeCode < (this->time_exec).internalTimeCode) goto LAB_00303065;
  }
  else {
    lVar3 = (this->time_message).internalTimeCode;
    lVar2 = (this->time_value).internalTimeCode;
    if (lVar2 < lVar3) {
      lVar3 = lVar2;
    }
    (this->time_exec).internalTimeCode = lVar3;
    if (lVar3 != 0x7fffffffffffffff) {
      (this->time_exec).internalTimeCode = lVar3 + (this->info).inputDelay.internalTimeCode;
    }
    lVar3 = (this->time_exec).internalTimeCode;
    lVar2 = (this->time_granted).internalTimeCode;
    lVar5 = (this->time_requested).internalTimeCode;
    if (lVar3 < lVar5) {
      lVar5 = lVar3;
    }
    (this->time_exec).internalTimeCode = lVar5;
    if (lVar5 <= lVar2) {
      TVar4.internalTimeCode = lVar2;
      if (this->iterating == NO_ITERATIONS) {
        TVar4 = getNextPossibleTime(this);
      }
      (this->time_exec).internalTimeCode = TVar4.internalTimeCode;
    }
    TVar4.internalTimeCode = (this->time_exec).internalTimeCode;
    if (TVar4.internalTimeCode <= lVar2 && lVar2 != 0x7fffffffffffffff) goto LAB_00303116;
LAB_00303107:
    TVar4 = generateAllowedTime(this,TVar4);
  }
  (this->time_exec).internalTimeCode = TVar4.internalTimeCode;
LAB_00303116:
  return (this->time_exec).internalTimeCode != lVar1;
}

Assistant:

bool TimeCoordinator::updateNextExecutionTime()
{
    auto cexec = time_exec;
    if (info.uninterruptible) {
        if (iterating == IterationRequest::NO_ITERATIONS) {
            time_exec = generateAllowedTime(time_requested);
        } else {
            time_exec = std::min(time_message, time_value);
            if (time_exec < Time::maxVal()) {
                time_exec += info.inputDelay;
            }
            time_exec =
                (time_exec <= time_granted) ? time_granted : generateAllowedTime(time_requested);
        }
    } else {
        time_exec = std::min(time_message, time_value);
        if (time_exec < Time::maxVal()) {
            time_exec += info.inputDelay;
        }
        time_exec = std::min(time_requested, time_exec);
        if (time_exec <= time_granted) {
            time_exec = (iterating == IterationRequest::NO_ITERATIONS) ? getNextPossibleTime() :
                                                                         time_granted;
        }
        if (time_granted < Time::maxVal()) {
            if (time_exec > time_granted) {
                time_exec = generateAllowedTime(time_exec);
            }
        } else {
            time_exec = generateAllowedTime(time_exec);
        }
    }

    return (time_exec != cexec);
}